

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::BeginMainMenuBar(void)

{
  ImGuiViewportP *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  bool bVar4;
  float fVar5;
  ImVec2 local_28;
  
  pIVar2 = GImGui;
  pIVar1 = *(GImGui->Viewports).Data;
  fVar5 = (GImGui->Style).DisplaySafeAreaPadding.y - (GImGui->Style).FramePadding.y;
  (GImGui->NextWindowData).MenuBarOffsetMinVal.x = (GImGui->Style).DisplaySafeAreaPadding.x;
  (pIVar2->NextWindowData).MenuBarOffsetMinVal.y = (float)(-(uint)(0.0 <= fVar5) & (uint)fVar5);
  local_28.x = 0.0;
  local_28.y = 0.0;
  bVar4 = false;
  SetNextWindowPos(&(pIVar1->super_ImGuiViewport).Pos,0,&local_28);
  local_28.y = (pIVar2->NextWindowData).MenuBarOffsetMinVal.y + pIVar2->FontBaseSize +
               (pIVar2->Style).FramePadding.y;
  local_28.x = (pIVar1->super_ImGuiViewport).Size.x;
  SetNextWindowSize(&local_28,0);
  SetNextWindowViewport((pIVar1->super_ImGuiViewport).ID);
  PushStyleVar(2,0.0);
  local_28.x = 0.0;
  local_28.y = 0.0;
  PushStyleVar(4,&local_28);
  bVar3 = Begin("##MainMenuBar",(bool *)0x0,0x20050f);
  if (bVar3) {
    bVar4 = BeginMenuBar();
  }
  PopStyleVar(2);
  (pIVar2->NextWindowData).MenuBarOffsetMinVal.x = 0.0;
  (pIVar2->NextWindowData).MenuBarOffsetMinVal.y = 0.0;
  if (bVar4 == false) {
    End();
  }
  return bVar4;
}

Assistant:

bool ImGui::BeginMainMenuBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiViewport* viewport = g.Viewports[0];
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(g.Style.DisplaySafeAreaPadding.x, ImMax(g.Style.DisplaySafeAreaPadding.y - g.Style.FramePadding.y, 0.0f));
    SetNextWindowPos(viewport->Pos);
    SetNextWindowSize(ImVec2(viewport->Size.x, g.NextWindowData.MenuBarOffsetMinVal.y + g.FontBaseSize + g.Style.FramePadding.y));
    SetNextWindowViewport(viewport->ID); // Enforce viewport so we don't create our onw viewport when ImGuiConfigFlags_ViewportsNoMerge is set.
    PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
    PushStyleVar(ImGuiStyleVar_WindowMinSize, ImVec2(0, 0));
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoDocking | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_MenuBar;
    bool is_open = Begin("##MainMenuBar", NULL, window_flags) && BeginMenuBar();
    PopStyleVar(2);
    g.NextWindowData.MenuBarOffsetMinVal = ImVec2(0.0f, 0.0f);
    if (!is_open)
    {
        End();
        return false;
    }
    return true; //-V1020
}